

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O3

int av1_search_palette_mode
              (IntraModeSearchState *intra_search_state,AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize
              ,uint ref_frame_cost,PICK_MODE_CONTEXT *ctx,RD_STATS *this_rd_cost,int64_t best_rd)

{
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  MB_MODE_INFO *pMVar4;
  PALETTE_BUFFER *best_palette_color_map;
  uint8_t *__dest;
  MB_MODE_INFO *pMVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int64_t iVar11;
  uint8_t uVar12;
  UV_PREDICTION_MODE UVar13;
  byte bVar14;
  int (*paiVar15) [2];
  undefined7 in_register_00000009;
  long lVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  int64_t best_rd_palette;
  RD_STATS rd_stats_y;
  MB_MODE_INFO best_mbmi_palette;
  uint8_t best_tx_type_map [1024];
  uint8_t best_blk_skip [1024];
  
  lVar21 = 0x7fffffffffffffff;
  pMVar4 = *(x->e_mbd).mi;
  uVar1 = ((cpi->common).seq_params)->monochrome;
  best_rd_palette = best_rd;
  best_palette_color_map = x->palette_buffer;
  __dest = (x->e_mbd).plane[0].color_index_map;
  memcpy(&best_mbmi_palette,pMVar4,0xb0);
  uVar19 = CONCAT71(in_register_00000009,bsize) & 0xffffffff;
  bVar2 = ""[uVar19];
  bVar14 = block_size_high[uVar19];
  bVar3 = block_size_wide[uVar19];
  pMVar4->mode = '\0';
  pMVar4->uv_mode = '\0';
  pMVar4->ref_frame[0] = '\0';
  pMVar4->ref_frame[1] = -1;
  (pMVar4->palette_mode_info).palette_size[0] = '\0';
  (pMVar4->palette_mode_info).palette_size[1] = '\0';
  rd_stats_y.rate = 0x7fffffff;
  rd_stats_y.zero_rate = 0;
  rd_stats_y.dist = 0x7fffffffffffffff;
  rd_stats_y.rdcost = 0x7fffffffffffffff;
  rd_stats_y.sse = 0x7fffffffffffffff;
  rd_stats_y.skip_txfm = '\0';
  uVar20 = 0;
  av1_rd_pick_palette_intra_sby
            (cpi,x,bsize,(x->mode_costs).mbmode_cost[bVar2][0],&best_mbmi_palette,
             best_palette_color_map->best_palette_color_map,&best_rd_palette,&rd_stats_y.rate,
             (int *)0x0,&rd_stats_y.dist,&rd_stats_y.skip_txfm,(int *)0x0,ctx,best_blk_skip,
             best_tx_type_map);
  if ((rd_stats_y.rate == 0x7fffffff) || ((pMVar4->palette_mode_info).palette_size[0] == '\0'))
  goto LAB_002473f7;
  memcpy((x->txfm_search_info).blk_skip,best_blk_skip,
         (long)(1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[uVar19] - 4 &
                     0x1f)));
  memcpy((x->e_mbd).tx_type_map,best_tx_type_map,(long)ctx->num_4x4_blk);
  memcpy(__dest,best_palette_color_map,(ulong)bVar3 * (ulong)bVar14);
  uVar12 = rd_stats_y.skip_txfm;
  iVar11 = rd_stats_y.dist;
  uVar18 = rd_stats_y.rate + ref_frame_cost;
  uVar20 = (uint)rd_stats_y.skip_txfm;
  if (uVar1 == '\0') {
    if (intra_search_state->rate_uv_intra == 0x7fffffff) {
      pMVar5 = *(x->e_mbd).mi;
      if ((x->e_mbd).lossless[*(ushort *)&pMVar5->field_0xa7 & 7] == 0) {
        bVar2 = ""[av1_ss_size_lookup[pMVar5->bsize][(x->e_mbd).plane[1].subsampling_x]
                   [(x->e_mbd).plane[1].subsampling_y]];
        if (bVar2 < 0x11) {
          bVar14 = 3;
          if ((1 < bVar2 - 0xb) && (bVar14 = 3, bVar2 != 4)) {
LAB_0024747f:
            bVar14 = bVar2;
          }
        }
        else if (bVar2 == 0x11) {
          bVar14 = 9;
        }
        else {
          if (bVar2 != 0x12) goto LAB_0024747f;
          bVar14 = 10;
        }
      }
      else {
        bVar14 = 0;
      }
      av1_rd_pick_intra_sbuv_mode
                (cpi,x,&intra_search_state->rate_uv_intra,&intra_search_state->rate_uv_tokenonly,
                 &intra_search_state->dist_uvs,&intra_search_state->skip_uvs,bsize,bVar14);
      UVar13 = pMVar4->uv_mode;
      intra_search_state->mode_uv = UVar13;
      *(undefined2 *)(intra_search_state->pmi_uv).palette_size =
           *(undefined2 *)(pMVar4->palette_mode_info).palette_size;
      uVar6 = *(undefined8 *)(pMVar4->palette_mode_info).palette_colors;
      uVar7 = *(undefined8 *)((pMVar4->palette_mode_info).palette_colors + 4);
      uVar8 = *(undefined8 *)((pMVar4->palette_mode_info).palette_colors + 8);
      uVar9 = *(undefined8 *)((pMVar4->palette_mode_info).palette_colors + 0xc);
      uVar10 = *(undefined8 *)((pMVar4->palette_mode_info).palette_colors + 0x14);
      *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0x10) =
           *(undefined8 *)((pMVar4->palette_mode_info).palette_colors + 0x10);
      *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0x14) = uVar10;
      *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 8) = uVar8;
      *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0xc) = uVar9;
      *(undefined8 *)(intra_search_state->pmi_uv).palette_colors = uVar6;
      *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 4) = uVar7;
      intra_search_state->uv_angle_delta = pMVar4->angle_delta[1];
    }
    else {
      UVar13 = intra_search_state->mode_uv;
    }
    pMVar4->uv_mode = UVar13;
    uVar1 = (intra_search_state->pmi_uv).palette_size[1];
    (pMVar4->palette_mode_info).palette_size[1] = uVar1;
    if (uVar1 != '\0') {
      uVar6 = *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 8);
      uVar7 = *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0xc);
      uVar8 = *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0x14);
      *(undefined8 *)((pMVar4->palette_mode_info).palette_colors + 0x10) =
           *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0x10);
      *(undefined8 *)((pMVar4->palette_mode_info).palette_colors + 0x14) = uVar8;
      *(undefined8 *)((pMVar4->palette_mode_info).palette_colors + 8) = uVar6;
      *(undefined8 *)((pMVar4->palette_mode_info).palette_colors + 0xc) = uVar7;
    }
    pMVar4->angle_delta[1] = intra_search_state->uv_angle_delta;
    if (uVar12 == '\0') {
      rd_stats_y.dist = iVar11 + intra_search_state->dist_uvs;
      uVar18 = uVar18 + intra_search_state->rate_uv_intra;
    }
    else {
      rd_stats_y.dist = iVar11 + intra_search_state->dist_uvs;
      uVar18 = uVar18 + intra_search_state->rate_uv_intra;
      if (intra_search_state->skip_uvs != '\0') {
        ref_frame_cost = uVar18 - (rd_stats_y.rate + intra_search_state->rate_uv_tokenonly);
        uVar20 = 1;
        goto LAB_00247340;
      }
    }
LAB_00247389:
    ref_frame_cost = uVar18;
    pMVar4 = (x->e_mbd).left_mbmi;
    pMVar5 = (x->e_mbd).above_mbmi;
    if (pMVar5 == (MB_MODE_INFO *)0x0) {
      uVar18 = 0;
    }
    else {
      uVar18 = (uint)pMVar5->skip_txfm;
    }
    uVar20 = 0;
    if (pMVar4 == (MB_MODE_INFO *)0x0) {
      uVar17 = 0;
    }
    else {
      uVar17 = (uint)pMVar4->skip_txfm;
    }
    paiVar15 = (x->mode_costs).skip_txfm_cost + (uVar17 + uVar18);
  }
  else {
    if (rd_stats_y.skip_txfm == '\0') goto LAB_00247389;
LAB_00247340:
    pMVar4 = (x->e_mbd).left_mbmi;
    pMVar5 = (x->e_mbd).above_mbmi;
    if (pMVar5 == (MB_MODE_INFO *)0x0) {
      uVar18 = 0;
    }
    else {
      uVar18 = (uint)pMVar5->skip_txfm;
    }
    if (pMVar4 == (MB_MODE_INFO *)0x0) {
      uVar17 = 0;
    }
    else {
      uVar17 = (uint)pMVar4->skip_txfm;
    }
    paiVar15 = (int (*) [2])((x->mode_costs).skip_txfm_cost[uVar17 + uVar18] + 1);
  }
  lVar16 = (long)(int)ref_frame_cost + (long)(*paiVar15)[0];
  lVar21 = rd_stats_y.dist * 0x80 + (x->rdmult * lVar16 + 0x100 >> 9);
  this_rd_cost->rate = (int)lVar16;
  this_rd_cost->dist = rd_stats_y.dist;
LAB_002473f7:
  this_rd_cost->rdcost = lVar21;
  return uVar20;
}

Assistant:

int av1_search_palette_mode(IntraModeSearchState *intra_search_state,
                            const AV1_COMP *cpi, MACROBLOCK *x,
                            BLOCK_SIZE bsize, unsigned int ref_frame_cost,
                            PICK_MODE_CONTEXT *ctx, RD_STATS *this_rd_cost,
                            int64_t best_rd) {
  const AV1_COMMON *const cm = &cpi->common;
  MB_MODE_INFO *const mbmi = x->e_mbd.mi[0];
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  int rate2 = 0;
  int64_t distortion2 = 0, best_rd_palette = best_rd, this_rd;
  int skippable = 0;
  uint8_t *const best_palette_color_map =
      x->palette_buffer->best_palette_color_map;
  uint8_t *const color_map = xd->plane[0].color_index_map;
  MB_MODE_INFO best_mbmi_palette = *mbmi;
  uint8_t best_blk_skip[MAX_MIB_SIZE * MAX_MIB_SIZE];
  uint8_t best_tx_type_map[MAX_MIB_SIZE * MAX_MIB_SIZE];
  const ModeCosts *mode_costs = &x->mode_costs;
  const int *const intra_mode_cost =
      mode_costs->mbmode_cost[size_group_lookup[bsize]];
  const int rows = block_size_high[bsize];
  const int cols = block_size_wide[bsize];

  mbmi->mode = DC_PRED;
  mbmi->uv_mode = UV_DC_PRED;
  mbmi->ref_frame[0] = INTRA_FRAME;
  mbmi->ref_frame[1] = NONE_FRAME;
  av1_zero(pmi->palette_size);

  RD_STATS rd_stats_y;
  av1_invalid_rd_stats(&rd_stats_y);
  av1_rd_pick_palette_intra_sby(cpi, x, bsize, intra_mode_cost[DC_PRED],
                                &best_mbmi_palette, best_palette_color_map,
                                &best_rd_palette, &rd_stats_y.rate, NULL,
                                &rd_stats_y.dist, &rd_stats_y.skip_txfm, NULL,
                                ctx, best_blk_skip, best_tx_type_map);
  if (rd_stats_y.rate == INT_MAX || pmi->palette_size[0] == 0) {
    this_rd_cost->rdcost = INT64_MAX;
    return skippable;
  }

  memcpy(x->txfm_search_info.blk_skip, best_blk_skip,
         sizeof(best_blk_skip[0]) * bsize_to_num_blk(bsize));
  av1_copy_array(xd->tx_type_map, best_tx_type_map, ctx->num_4x4_blk);
  memcpy(color_map, best_palette_color_map,
         rows * cols * sizeof(best_palette_color_map[0]));

  skippable = rd_stats_y.skip_txfm;
  distortion2 = rd_stats_y.dist;
  rate2 = rd_stats_y.rate + ref_frame_cost;
  if (num_planes > 1) {
    if (intra_search_state->rate_uv_intra == INT_MAX) {
      // We have not found any good uv mode yet, so we need to search for it.
      TX_SIZE uv_tx = av1_get_tx_size(AOM_PLANE_U, xd);
      av1_rd_pick_intra_sbuv_mode(cpi, x, &intra_search_state->rate_uv_intra,
                                  &intra_search_state->rate_uv_tokenonly,
                                  &intra_search_state->dist_uvs,
                                  &intra_search_state->skip_uvs, bsize, uv_tx);
      intra_search_state->mode_uv = mbmi->uv_mode;
      intra_search_state->pmi_uv = *pmi;
      intra_search_state->uv_angle_delta = mbmi->angle_delta[PLANE_TYPE_UV];
    }

    // We have found at least one good uv mode before, so copy and paste it
    // over.
    mbmi->uv_mode = intra_search_state->mode_uv;
    pmi->palette_size[1] = intra_search_state->pmi_uv.palette_size[1];
    if (pmi->palette_size[1] > 0) {
      memcpy(pmi->palette_colors + PALETTE_MAX_SIZE,
             intra_search_state->pmi_uv.palette_colors + PALETTE_MAX_SIZE,
             2 * PALETTE_MAX_SIZE * sizeof(pmi->palette_colors[0]));
    }
    mbmi->angle_delta[PLANE_TYPE_UV] = intra_search_state->uv_angle_delta;
    skippable = skippable && intra_search_state->skip_uvs;
    distortion2 += intra_search_state->dist_uvs;
    rate2 += intra_search_state->rate_uv_intra;
  }

  if (skippable) {
    rate2 -= rd_stats_y.rate;
    if (num_planes > 1) rate2 -= intra_search_state->rate_uv_tokenonly;
    rate2 += mode_costs->skip_txfm_cost[av1_get_skip_txfm_context(xd)][1];
  } else {
    rate2 += mode_costs->skip_txfm_cost[av1_get_skip_txfm_context(xd)][0];
  }
  this_rd = RDCOST(x->rdmult, rate2, distortion2);
  this_rd_cost->rate = rate2;
  this_rd_cost->dist = distortion2;
  this_rd_cost->rdcost = this_rd;
  return skippable;
}